

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::RefBuilderLarge
::attachBuildRefs(RefBuilderLarge *this,
                 BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  atomic<int> *paVar1;
  BVHN<4> *pBVar2;
  ulong uVar3;
  BuildRef *pBVar4;
  bool bVar5;
  int iVar6;
  undefined4 uVar7;
  undefined7 extraout_var;
  TriangleMesh *pTVar8;
  undefined1 auVar9 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  float fVar14;
  float fVar15;
  
  pBVar2 = (topBuilder->bvh->objects).
           super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
           super__Vector_impl_data._M_start[this->objectID_];
  bVar5 = BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::isGeometryModified
                    (topBuilder,this->objectID_);
  iVar6 = (int)CONCAT71(extraout_var,bVar5);
  if (bVar5) {
    iVar6 = (*(((this->builder_).ptr)->super_RefCount)._vptr_RefCount[4])();
  }
  auVar9 = minps((undefined1  [16])(pBVar2->super_AccelData).bounds.bounds0.lower.field_0,
                 (undefined1  [16])(pBVar2->super_AccelData).bounds.bounds1.lower.field_0);
  auVar11 = maxps((undefined1  [16])(pBVar2->super_AccelData).bounds.bounds0.upper.field_0,
                  (undefined1  [16])(pBVar2->super_AccelData).bounds.bounds1.upper.field_0);
  auVar12._4_4_ = -(uint)(auVar9._4_4_ <= auVar11._4_4_);
  auVar12._0_4_ = -(uint)(auVar9._0_4_ <= auVar11._0_4_);
  auVar12._8_4_ = -(uint)(auVar9._8_4_ <= auVar11._8_4_);
  auVar12._12_4_ = -(uint)(auVar9._12_4_ <= auVar11._12_4_);
  uVar7 = movmskps(iVar6,auVar12);
  if ((~(byte)uVar7 & 7) == 0) {
    pTVar8 = BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::getMesh
                       (topBuilder,this->objectID_);
    auVar9 = minps((undefined1  [16])(pBVar2->super_AccelData).bounds.bounds0.lower.field_0,
                   (undefined1  [16])(pBVar2->super_AccelData).bounds.bounds1.lower.field_0);
    auVar12 = maxps((undefined1  [16])(pBVar2->super_AccelData).bounds.bounds0.upper.field_0,
                    (undefined1  [16])(pBVar2->super_AccelData).bounds.bounds1.upper.field_0);
    uVar3 = (pBVar2->root).ptr;
    aVar10._0_12_ = auVar9._0_12_;
    aVar10.m128[3] = (float)(int)this->objectID_;
    aVar13._0_12_ = auVar12._0_12_;
    aVar13.m128[3] = (float)(pTVar8->super_Geometry).numPrimitives;
    fVar14 = 0.0;
    if ((uVar3 & 8) == 0) {
      fVar14 = auVar12._4_4_ - auVar9._4_4_;
      fVar15 = auVar12._8_4_ - auVar9._8_4_;
      fVar14 = (fVar14 + fVar15) * (auVar12._0_4_ - auVar9._0_4_) + fVar15 * fVar14;
      fVar14 = fVar14 + fVar14;
    }
    LOCK();
    paVar1 = &topBuilder->nextRef;
    iVar6 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    pBVar4 = (topBuilder->refs).items;
    pBVar4[iVar6].super_PrimRef.lower.field_0 = aVar10;
    pBVar4[iVar6].super_PrimRef.upper.field_0 = aVar13;
    pBVar4[iVar6].node.ptr = uVar3;
    pBVar4[iVar6].bounds_area = fVar14;
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder)
        {
          BVH* object  = topBuilder->getBVH(objectID_); assert(object);
          
          /* build object if it got modified */
          if (topBuilder->isGeometryModified(objectID_))
            builder_->build();

          /* create build primitive */
          if (!object->getBounds().empty())
          {
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            Mesh* mesh = topBuilder->getMesh(objectID_);
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(object->getBounds(),object->root,(unsigned int)objectID_,(unsigned int)mesh->size());
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(object->getBounds(),object->root);
#endif
          }
        }